

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateAttributeType
          (HtmlparserCppTest *this,string *expected_attr_type)

{
  __type _Var1;
  int enum_id;
  char *pcVar2;
  HtmlparserCppTest *this_00;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = (HtmlparserCppTest *)&this->parser_;
  enum_id = HtmlParser::AttributeType((HtmlParser *)this_00);
  pcVar2 = IdToName(this_00,(IdNameMap *)kAttributeTypeMap,enum_id);
  if (expected_attr_type->_M_string_length == 0) {
    fprintf(_stderr,"Check failed: %s\n","!expected_attr_type.empty()");
  }
  else {
    std::__cxx11::string::string((string *)&local_30,pcVar2,&local_31);
    _Var1 = std::operator==(expected_attr_type,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (_Var1) {
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","expected_attr_type","==","string(parsed_attr_type)")
    ;
  }
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateAttributeType(
    const string &expected_attr_type) {
  const char *parsed_attr_type = IdToName(kAttributeTypeMap,
                                          parser_.AttributeType());
  EXPECT_TRUE(parsed_attr_type != NULL);
  EXPECT_TRUE(!expected_attr_type.empty());
  EXPECT_EQ(expected_attr_type, string(parsed_attr_type))
      << "Unexpected attr_type value at line " << parser_.line_number();
}